

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel_oaa.cc
# Opt level: O3

void predict_or_learn<false>(multi_oaa *o,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  ulong uVar2;
  labels preds;
  labels multilabels;
  uint local_8c;
  polyprediction *local_88;
  label_t *local_80;
  v_array<unsigned_int> local_78;
  label_t local_58;
  label_t lStack_50;
  label_t local_48;
  label_t lStack_40;
  
  local_80 = (label_t *)&ec->l;
  local_58 = (ec->l).multi;
  lStack_50 = (label_t)(ec->l).cs.costs._end;
  local_48 = (label_t)(ec->l).cs.costs.end_array;
  lStack_40 = (label_t)(ec->l).cs.costs.erase_count;
  local_88 = &ec->pred;
  local_78._begin = (uint *)(ec->pred).scalars._begin;
  local_78._end = (uint *)(ec->pred).scalars._end;
  local_78.end_array = (uint *)(ec->pred).scalars.end_array;
  local_78.erase_count = (ec->pred).scalars.erase_count;
  v_array<unsigned_int>::clear(&local_78);
  (ec->l).cs.costs._begin = (wclass *)0x3f8000007f7fffff;
  (ec->l).simple.initial = 0.0;
  local_8c = 0;
  if (o->k != 0) {
    uVar2 = 0;
    do {
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar2);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)((int)uVar2 * *(int *)(base + 0xe0));
      if (0.0 < (ec->pred).scalar) {
        v_array<unsigned_int>::push_back(&local_78,&local_8c);
      }
      local_8c = local_8c + 1;
      uVar2 = (ulong)local_8c;
    } while (uVar2 < o->k);
  }
  (local_88->scalars).end_array = (float *)local_78.end_array;
  (local_88->scalars).erase_count = local_78.erase_count;
  (local_88->scalars)._begin = (float *)local_78._begin;
  (local_88->scalars)._end = (float *)local_78._end;
  local_80[2] = local_48;
  local_80[3] = lStack_40;
  *local_80 = local_58;
  local_80[1] = lStack_50;
  return;
}

Assistant:

void predict_or_learn(multi_oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTILABEL::labels multilabels = ec.l.multilabels;
  MULTILABEL::labels preds = ec.pred.multilabels;
  preds.label_v.clear();

  ec.l.simple = {FLT_MAX, 1.f, 0.f};
  uint32_t multilabel_index = 0;
  for (uint32_t i = 0; i < o.k; i++)
  {
    if (is_learn)
    {
      ec.l.simple.label = -1.f;
      if (multilabels.label_v.size() > multilabel_index && multilabels.label_v[multilabel_index] == i)
      {
        ec.l.simple.label = 1.f;
        multilabel_index++;
      }
      base.learn(ec, i);
    }
    else
      base.predict(ec, i);
    if (ec.pred.scalar > 0.)
      preds.label_v.push_back(i);
  }
  if (is_learn && multilabel_index < multilabels.label_v.size())
    cout << "label " << multilabels.label_v[multilabel_index] << " is not in {0," << o.k - 1
         << "} This won't work right." << endl;

  ec.pred.multilabels = preds;
  ec.l.multilabels = multilabels;
}